

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmComputeShaderCase.cpp
# Opt level: O0

void __thiscall
vkt::SpirVAssembly::SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
          (SpvAsmComputeShaderCase *this,TestContext *testCtx,char *name,char *description,
          ComputeShaderSpec *spec,ComputeTestFeatures features)

{
  ComputeShaderSpec *__s;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  ComputeTestFeatures local_34;
  ComputeShaderSpec *pCStack_30;
  ComputeTestFeatures features_local;
  ComputeShaderSpec *spec_local;
  char *description_local;
  char *name_local;
  TestContext *testCtx_local;
  SpvAsmComputeShaderCase *this_local;
  
  local_34 = features;
  pCStack_30 = spec;
  spec_local = (ComputeShaderSpec *)description;
  description_local = name;
  name_local = (char *)testCtx;
  testCtx_local = (TestContext *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,name,&local_59);
  __s = spec_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,(char *)__s,&local_91);
  TestCase::TestCase(&this->super_TestCase,testCtx,&local_58,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SpvAsmComputeShaderCase_016a76a0;
  ComputeShaderSpec::ComputeShaderSpec(&this->m_shaderSpec,pCStack_30);
  this->m_features = local_34;
  return;
}

Assistant:

SpvAsmComputeShaderCase::SpvAsmComputeShaderCase (tcu::TestContext& testCtx, const char* name, const char* description, const ComputeShaderSpec& spec, const ComputeTestFeatures features)
	: TestCase		(testCtx, name, description)
	, m_shaderSpec	(spec)
	, m_features	(features)
{
}